

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

lword term_absexp(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lword val;
  lword local_10;
  
  local_10 = 0;
  bVar2 = startofblock('(');
  if (bVar2 == 0) {
    local_10 = 0;
  }
  else {
    iVar3 = parse_expr(-1,&local_10);
    pcVar1 = scriptname;
    if (iVar3 == 0) {
      uVar4 = getlineno();
      error(0x43,pcVar1,(ulong)uVar4);
    }
    endofblock('(',')');
  }
  return local_10;
}

Assistant:

static lword term_absexp(void)
{
  lword val = 0;

  if (startofblock('(')) {
    if (!parse_expr(-1,&val))
      error(67,scriptname,getlineno());  /* Absolute number expected */
    endofblock('(',')');
  }
  return val;
}